

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_04.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 in_RAX;
  istream *this;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  int number2;
  int number1;
  undefined8 local_18;
  
  local_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter two integers to compare: ",0x1f);
  this = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)((long)&local_18 + 4));
  std::istream::operator>>(this,(int *)&local_18);
  if (local_18._4_4_ == (int)local_18) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," == ",4);
    plVar3 = (long *)std::ostream::operator<<(poVar2,(int)local_18);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  iVar4 = (int)local_18;
  if (local_18._4_4_ != (int)local_18) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    plVar3 = (long *)std::ostream::operator<<(poVar2,(int)local_18);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    if (local_18._4_4_ < (int)local_18) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18._4_4_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," < ",3);
      plVar3 = (long *)std::ostream::operator<<(poVar2,(int)local_18);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
    iVar4 = local_18._4_4_;
    iVar1 = (int)local_18;
    if ((int)local_18 < local_18._4_4_) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18._4_4_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," > ",3);
      plVar3 = (long *)std::ostream::operator<<(poVar2,(int)local_18);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      iVar4 = local_18._4_4_;
      iVar1 = (int)local_18;
    }
    if (iVar1 < iVar4) goto LAB_00101416;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," <= ",4);
  plVar3 = (long *)std::ostream::operator<<(poVar2,(int)local_18);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar4 = local_18._4_4_;
  iVar1 = (int)local_18;
LAB_00101416:
  if (iVar1 <= iVar4) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," >= ",4);
    plVar3 = (long *)std::ostream::operator<<(poVar2,(int)local_18);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    int number1;
    int number2;

    std::cout << "Enter two integers to compare: ";  // prompt user for data
    std::cin >> number1 >> number2;  // read two integers from user

    if (number1 == number2)
        std::cout << number1 << " == " << number2 << std::endl;

    if (number1 != number2)
        std::cout << number1 << " != " << number2 << std::endl;

    if (number1 < number2)
        std::cout << number1 << " < " << number2 << std::endl;

    if (number1 > number2)
        std::cout << number1 << " > " << number2 << std::endl;

    if (number1 <= number2)
        std::cout << number1 << " <= " << number2 << std::endl;

    if (number1 >= number2)
        std::cout << number1 << " >= " << number2 << std::endl;

    return 0;
}